

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O2

uint * Gia_ManTerStateCreate(Gia_ManTer_t *p)

{
  uint *pInfo;
  int **ppiVar1;
  int iVar2;
  uint Value;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar2 = p->pAig->vCis->nSize;
  iVar3 = p->pAig->nRegs;
  iVar4 = iVar2 - iVar3;
  pInfo = Gia_ManTerStateAlloc(p->nStateWords);
  iVar3 = iVar2 * 2 + iVar3 * -2;
  for (lVar5 = 0; iVar4 + lVar5 < (long)iVar2; lVar5 = lVar5 + 1) {
    Value = p->pDataSimCis[(int)lVar5 + iVar4 >> 4] >> ((byte)iVar3 & 0x1e) & 3;
    Gia_ManTerSimInfoSet(pInfo,(int)lVar5,Value);
    ppiVar1 = &p->pCount0;
    if ((Value == 1) || (ppiVar1 = &p->pCountX, Value == 3)) {
      (*ppiVar1)[lVar5] = (*ppiVar1)[lVar5] + 1;
    }
    iVar2 = p->pAig->vCis->nSize;
    iVar3 = iVar3 + 2;
  }
  Vec_PtrPush(p->vStates,pInfo);
  return pInfo;
}

Assistant:

unsigned * Gia_ManTerStateCreate( Gia_ManTer_t * p )
{
    int i, Value, nPis = Gia_ManPiNum(p->pAig);
    unsigned * pRes = Gia_ManTerStateAlloc( p->nStateWords );
    for ( i = nPis; i < Gia_ManCiNum(p->pAig); i++ )
    {
        Value = Gia_ManTerSimInfoGet( p->pDataSimCis, i );
        Gia_ManTerSimInfoSet( pRes, i-nPis, Value );
        if ( Value == GIA_ZER )
            p->pCount0[i-nPis]++;
        if ( Value == GIA_UND )
            p->pCountX[i-nPis]++;
    }
    Vec_PtrPush( p->vStates, pRes );
    return pRes;    
}